

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::span_write_bytes::test_method(span_write_bytes *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  array<unsigned_char,_2UL> *paVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined4 local_94;
  char *local_90;
  char *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  array<unsigned_char,_2UL> mut_arr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mut_arr._M_elems[0] = 0xaa;
  mut_arr._M_elems[1] = '\x11';
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x114;
  file.m_begin = (iterator)&local_50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_88 = "";
  local_94 = 0xaa;
  pvVar2 = (iterator)0x2;
  paVar3 = &mut_arr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_80,&local_90,0x114,1,2,paVar3,"mut_arr.at(0)",&local_94,"0xaa");
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)paVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x115;
  file_00.m_begin = (iterator)&local_a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c0 = "";
  local_94 = 0x11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_80,&local_c8,0x115,1,2,mut_arr._M_elems + 1,"mut_arr.at(1)",&local_94,"0x11");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(span_write_bytes)
{
    std::array mut_arr{uint8_t{0xaa}, uint8_t{0xbb}};
    const auto mut_bytes{MakeWritableByteSpan(mut_arr)};
    mut_bytes[1] = std::byte{0x11};
    BOOST_CHECK_EQUAL(mut_arr.at(0), 0xaa);
    BOOST_CHECK_EQUAL(mut_arr.at(1), 0x11);
}